

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetInputSource.cc
# Opt level: O2

void __thiscall OffsetInputSource::seek(OffsetInputSource *this,qpdf_offset_t offset,int whence)

{
  _func_int **pp_Var1;
  int extraout_var;
  runtime_error *this_00;
  ostream *poVar2;
  range_error *this_01;
  undefined4 in_register_00000014;
  undefined8 uVar3;
  element_type *peVar4;
  locale local_1c0 [8];
  string local_1b8 [32];
  ostringstream msg;
  
  uVar3 = CONCAT44(in_register_00000014,whence);
  if (whence == 0) {
    if (this->max_safe_offset < offset) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      std::locale::classic();
      std::ios::imbue(local_1c0);
      std::locale::~locale(local_1c0);
      poVar2 = std::operator<<((ostream *)&msg,"seeking to ");
      poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
      poVar2 = std::operator<<(poVar2," offset by ");
      poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
      std::operator<<(poVar2," would cause an overflow of the offset type");
      this_01 = (range_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::range_error::range_error(this_01,local_1b8);
      __cxa_throw(this_01,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    peVar4 = (this->proxied).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    offset = offset + this->global_offset;
    pp_Var1 = peVar4->_vptr_InputSource;
    uVar3 = 0;
  }
  else {
    peVar4 = (this->proxied).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pp_Var1 = peVar4->_vptr_InputSource;
  }
  (*pp_Var1[5])(peVar4,offset,uVar3);
  (*(this->super_InputSource)._vptr_InputSource[4])(this);
  if (-1 < extraout_var) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"offset input source: seek before beginning of file");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
OffsetInputSource::seek(qpdf_offset_t offset, int whence)
{
    if (whence == SEEK_SET) {
        if (offset > this->max_safe_offset) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "seeking to " << offset << " offset by " << global_offset
                << " would cause an overflow of the offset type";
            throw std::range_error(msg.str());
        }
        this->proxied->seek(offset + global_offset, whence);
    } else {
        this->proxied->seek(offset, whence);
    }
    if (tell() < 0) {
        throw std::runtime_error("offset input source: seek before beginning of file");
    }
}